

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,DSPOMDP *model)

{
  pointer ppSVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  log_ostream *plVar4;
  ostream *poVar5;
  int iVar6;
  int i;
  ulong uVar7;
  double dVar8;
  double max;
  double dVar9;
  State *particle;
  value_type local_38;
  
  max = 1.0 / (double)num;
  dVar8 = Random::NextDouble((Random *)&Random::RANDOM,0.0,max);
  dVar9 = (*(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start)->weight;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 0;
  if (num < 1) {
    num = 0;
  }
  iVar6 = 0;
  for (; iVar3 != num; iVar3 = iVar3 + 1) {
    for (; dVar9 < dVar8; dVar9 = dVar9 + ppSVar1[iVar6]->weight) {
      iVar2 = iVar6 + 1;
      ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      iVar6 = 0;
      if ((long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3 != (long)iVar2) {
        iVar6 = iVar2;
      }
    }
    iVar2 = (*model->_vptr_DSPOMDP[0x16])
                      (model,(particles->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar6]);
    local_38 = (value_type)CONCAT44(extraout_var,iVar2);
    local_38->weight = max;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              (__return_storage_ptr__,&local_38);
    dVar8 = dVar8 + max;
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<despot::State**,std::vector<despot::State*,std::allocator<despot::State*>>>>
            ((__normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
              )(__return_storage_ptr__->
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
              )(__return_storage_ptr__->
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (3 < iVar3) {
      plVar4 = logging::stream(4);
      poVar5 = std::operator<<(&plVar4->super_ostream,"[ParticleBelief::Sample] Sampled ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," particles");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(__return_storage_ptr__->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    iVar3 = logging::level();
    if (0 < iVar3) {
      iVar3 = logging::level();
      if (4 < iVar3) {
        plVar4 = logging::stream(5);
        poVar5 = std::operator<<(&plVar4->super_ostream," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = despot::operator<<(poVar5,(__return_storage_ptr__->
                                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar7]);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num, vector<State*> particles,
	const DSPOMDP* model) {

	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = particles[0]->weight;
	vector<State*> sample;
	for (int i = 0; i < num; i++) {
		while (mass > cur) {
			pos++;
			if (pos == particles.size())
				pos = 0;

			cur += particles[pos]->weight;
		}

		mass += unit;

		State* particle = model->Copy(particles[pos]);
		particle->weight = unit;
		sample.push_back(particle);
	}

	random_shuffle(sample.begin(), sample.end());

	logd << "[ParticleBelief::Sample] Sampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}